

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error llvm::createStringError(error_code EC,Twine *S)

{
  Twine *in_RCX;
  error_code EC_00;
  string local_48;
  
  Twine::str_abi_cxx11_(&local_48,in_RCX);
  EC_00._M_cat._4_4_ = 0;
  EC_00._0_12_ = EC._0_12_;
  createStringError(EC_00,(char *)S);
  std::__cxx11::string::~string((string *)&local_48);
  return (Error)EC._0_8_;
}

Assistant:

inline Error createStringError(std::error_code EC, const Twine &S) {
  return createStringError(EC, S.str().c_str());
}